

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack17_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x1ffff;
  out[1] = uVar1 >> 0x11;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x11 | (uVar2 & 3) << 0xf;
  out[2] = uVar2 >> 2 & 0x1ffff;
  out[3] = uVar2 >> 0x13;
  uVar1 = in[2];
  out[3] = uVar2 >> 0x13 | (uVar1 & 0xf) << 0xd;
  out[4] = uVar1 >> 4 & 0x1ffff;
  uVar2 = in[3];
  out[5] = uVar1 >> 0x15;
  out[5] = uVar1 >> 0x15 | (uVar2 & 0x3f) << 0xb;
  out[6] = uVar2 >> 6 & 0x1ffff;
  uVar1 = in[4];
  out[7] = uVar2 >> 0x17;
  out[7] = (uVar1 & 0xff) << 9 | uVar2 >> 0x17;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack17_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 2)) << (17 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 17);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 4)) << (17 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 17);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 6)) << (17 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 17);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 8)) << (17 - 8);
  out++;

  return in + 1;
}